

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O1

void CB_EXPLORE_ADF::get_cost_ranges
               (vector<float,_std::allocator<float>_> *min_costs,
               vector<float,_std::allocator<float>_> *max_costs,float delta,cb_explore_adf *data,
               multi_learner *base,multi_ex *examples,bool min_only)

{
  vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  *this;
  pointer *ppvVar1;
  pointer *ppvVar2;
  undefined8 *puVar3;
  label_t *plVar4;
  float fVar5;
  float fVar6;
  example *peVar7;
  float *pfVar8;
  float *pfVar9;
  pointer pvVar10;
  pointer pvVar11;
  pointer ppeVar12;
  iterator __position;
  iterator __position_00;
  action_score *paVar13;
  size_t sVar14;
  cb_class *pcVar15;
  cb_class *pcVar16;
  label_t lVar17;
  label_t lVar18;
  bool bVar19;
  action_score *paVar20;
  pointer pfVar21;
  ulong uVar22;
  pointer ppeVar23;
  multi_ex *__range1;
  size_type __new_size;
  long lVar24;
  example **ex;
  float fVar25;
  float fVar26;
  float fVar27;
  anon_union_4_2_947300a4 x;
  
  bVar19 = CB::ec_is_example_header
                     (*(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl
                       .super__Vector_impl_data._M_start);
  peVar7 = *(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pfVar8 = (peVar7->pred).scalars._begin;
  pfVar9 = (peVar7->pred).scalars._end;
  __new_size = (long)pfVar9 - (long)pfVar8 >> 3;
  std::vector<float,_std::allocator<float>_>::resize(min_costs,__new_size);
  std::vector<float,_std::allocator<float>_>::resize(max_costs,__new_size);
  pvVar10 = (data->ex_as).
            super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((data->ex_as).
      super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar10) {
    (data->ex_as).
    super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar10;
  }
  pvVar11 = (data->ex_costs).
            super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((data->ex_costs).
      super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pvVar11) {
    (data->ex_costs).
    super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pvVar11;
  }
  this = &data->ex_as;
  ppeVar12 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  for (ppeVar23 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_start; ppeVar23 != ppeVar12; ppeVar23 = ppeVar23 + 1) {
    peVar7 = *ppeVar23;
    __position._M_current =
         (data->ex_as).
         super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (data->ex_as).
        super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<v_array<ACTION_SCORE::action_score>,std::allocator<v_array<ACTION_SCORE::action_score>>>
      ::_M_realloc_insert<v_array<ACTION_SCORE::action_score>const&>
                ((vector<v_array<ACTION_SCORE::action_score>,std::allocator<v_array<ACTION_SCORE::action_score>>>
                  *)this,__position,(v_array<ACTION_SCORE::action_score> *)&(peVar7->pred).scalars);
    }
    else {
      paVar20 = (action_score *)(peVar7->pred).scalars._begin;
      paVar13 = (action_score *)(peVar7->pred).scalars._end;
      sVar14 = (peVar7->pred).scalars.erase_count;
      (__position._M_current)->end_array = (action_score *)(peVar7->pred).scalars.end_array;
      (__position._M_current)->erase_count = sVar14;
      (__position._M_current)->_begin = paVar20;
      (__position._M_current)->_end = paVar13;
      ppvVar1 = &(data->ex_as).
                 super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppvVar1 = *ppvVar1 + 1;
    }
    peVar7 = *ppeVar23;
    __position_00._M_current =
         (data->ex_costs).
         super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (data->ex_costs).
        super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<v_array<CB::cb_class>,std::allocator<v_array<CB::cb_class>>>::
      _M_realloc_insert<v_array<CB::cb_class>const&>
                ((vector<v_array<CB::cb_class>,std::allocator<v_array<CB::cb_class>>> *)
                 &data->ex_costs,__position_00,(v_array<CB::cb_class> *)&(peVar7->l).simple);
    }
    else {
      pcVar15 = (cb_class *)(peVar7->l).cs.costs._begin;
      pcVar16 = (cb_class *)(peVar7->l).cs.costs._end;
      sVar14 = (peVar7->l).cs.costs.erase_count;
      (__position_00._M_current)->end_array = (cb_class *)(peVar7->l).cs.costs.end_array;
      (__position_00._M_current)->erase_count = sVar14;
      (__position_00._M_current)->_begin = pcVar15;
      (__position_00._M_current)->_end = pcVar16;
      ppvVar2 = &(data->ex_costs).
                 super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppvVar2 = *ppvVar2 + 1;
    }
  }
  pvVar10 = (this->
            super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  paVar13 = pvVar10->_end;
  for (paVar20 = pvVar10->_begin; paVar20 != paVar13; paVar20 = paVar20 + 1) {
    ((examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
     super__Vector_impl_data._M_start[paVar20->action + (uint)bVar19]->pred).scalar = paVar20->score
    ;
  }
  if (pfVar9 != pfVar8) {
    fVar5 = data->min_cb_cost;
    fVar6 = data->max_cb_cost;
    lVar24 = 0;
    do {
      peVar7 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(ulong)bVar19 + lVar24];
      (peVar7->l).simple.label = fVar5 + -1.0;
      fVar25 = (float)(**(code **)(base + 0x50))
                                (*(undefined8 *)(base + 0x48),*(undefined8 *)(base + 0x20),peVar7);
      fVar27 = (peVar7->pred).scalar;
      if ((fVar27 < fVar5) || ((~(uint)fVar25 & 0x7f800000) == 0)) {
        pfVar21 = (min_costs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        fVar27 = fVar5;
LAB_0020f118:
        pfVar21[lVar24] = fVar27;
      }
      else {
        fVar26 = binary_search((fVar27 - fVar5) + 1.0,delta,fVar25,1e-06);
        fVar27 = fVar27 - fVar26 * fVar25;
        fVar25 = fVar5;
        if (fVar5 <= fVar27) {
          fVar25 = fVar27;
        }
        (min_costs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar24] = fVar25;
        pfVar21 = (min_costs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        fVar27 = fVar6;
        if (fVar6 < pfVar21[lVar24]) goto LAB_0020f118;
      }
      if (!min_only) {
        (peVar7->l).simple.label = fVar6 + 1.0;
        fVar25 = (float)(**(code **)(base + 0x50))
                                  (*(undefined8 *)(base + 0x48),*(undefined8 *)(base + 0x20),peVar7)
        ;
        fVar27 = (peVar7->pred).scalar;
        if ((fVar6 < fVar27) || ((~(uint)fVar25 & 0x7f800000) == 0)) {
          pfVar21 = (max_costs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          fVar27 = fVar6;
        }
        else {
          fVar26 = binary_search((fVar6 + 1.0) - fVar27,delta,fVar25,1e-06);
          fVar27 = fVar26 * fVar25 + fVar27;
          fVar25 = fVar6;
          if (fVar27 <= fVar6) {
            fVar25 = fVar27;
          }
          (max_costs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar24] = fVar25;
          pfVar21 = (max_costs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          fVar27 = fVar5;
          if (fVar5 < pfVar21[lVar24] || fVar5 == pfVar21[lVar24]) goto LAB_0020f17f;
        }
        pfVar21[lVar24] = fVar27;
      }
LAB_0020f17f:
      lVar24 = lVar24 + 1;
    } while (__new_size + (__new_size == 0) != lVar24);
  }
  ppeVar23 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if ((examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar23) {
    lVar24 = 0;
    uVar22 = 0;
    do {
      pvVar10 = (this->
                super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      peVar7 = ppeVar23[uVar22];
      puVar3 = (undefined8 *)((long)&pvVar10->_begin + lVar24);
      pfVar8 = (float *)*puVar3;
      pfVar9 = (float *)puVar3[1];
      puVar3 = (undefined8 *)((long)&pvVar10->end_array + lVar24);
      sVar14 = puVar3[1];
      (peVar7->pred).scalars.end_array = (float *)*puVar3;
      (peVar7->pred).scalars.erase_count = sVar14;
      (peVar7->pred).scalars._begin = pfVar8;
      (peVar7->pred).scalars._end = pfVar9;
      pvVar11 = (data->ex_costs).
                super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      peVar7 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar22];
      plVar4 = (label_t *)((long)&pvVar11->_begin + lVar24);
      lVar17 = *plVar4;
      lVar18 = plVar4[1];
      puVar3 = (undefined8 *)((long)&pvVar11->end_array + lVar24);
      sVar14 = puVar3[1];
      (peVar7->l).cs.costs.end_array = (wclass *)*puVar3;
      (peVar7->l).cs.costs.erase_count = sVar14;
      (peVar7->l).multi = lVar17;
      *(label_t *)&(peVar7->l).cs.costs._end = lVar18;
      uVar22 = uVar22 + 1;
      ppeVar23 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      lVar24 = lVar24 + 0x20;
    } while (uVar22 < (ulong)((long)(examples->
                                    super__Vector_base<example_*,_std::allocator<example_*>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar23 >> 3)
            );
  }
  return;
}

Assistant:

void get_cost_ranges(std::vector<float>& min_costs, std::vector<float>& max_costs, float delta, cb_explore_adf& data,
    multi_learner& base, multi_ex& examples, bool min_only)
{
  const bool shared = CB::ec_is_example_header(*examples[0]);
  const size_t num_actions = examples[0]->pred.a_s.size();
  min_costs.resize(num_actions);
  max_costs.resize(num_actions);

  auto& ex_as = data.ex_as;
  auto& ex_costs = data.ex_costs;
  ex_as.clear();
  ex_costs.clear();

  // backup cb example data
  for (auto& ex : examples)
  {
    ex_as.push_back(ex->pred.a_s);
    ex_costs.push_back(ex->l.cb.costs);
  }

  // set regressor predictions
  for (auto as : ex_as[0])
  {
    examples[shared + as.action]->pred.scalar = as.score;
  }

  const float cmin = data.min_cb_cost;
  const float cmax = data.max_cb_cost;

  for (size_t a = 0; a < num_actions; ++a)
  {
    example* ec = examples[shared + a];
    ec->l.simple.label = cmin - 1;
    float sens = base.sensitivity(*ec);
    float w = 0;  // importance weight

    if (ec->pred.scalar < cmin || nanpattern(sens) || infpattern(sens))
      min_costs[a] = cmin;
    else
    {
      w = binary_search(ec->pred.scalar - cmin + 1, delta, sens);
      min_costs[a] = max(ec->pred.scalar - sens * w, cmin);
      if (min_costs[a] > cmax)
        min_costs[a] = cmax;
    }

    if (!min_only)
    {
      ec->l.simple.label = cmax + 1;
      sens = base.sensitivity(*ec);
      if (ec->pred.scalar > cmax || nanpattern(sens) || infpattern(sens))
      {
        max_costs[a] = cmax;
      }
      else
      {
        w = binary_search(cmax + 1 - ec->pred.scalar, delta, sens);
        max_costs[a] = min(ec->pred.scalar + sens * w, cmax);
        if (max_costs[a] < cmin)
          max_costs[a] = cmin;
      }
    }
  }

  // reset cb example data
  for (size_t i = 0; i < examples.size(); ++i)
  {
    examples[i]->pred.a_s = ex_as[i];
    examples[i]->l.cb.costs = ex_costs[i];
  }
}